

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall ThreadPool::ThreadPool(ThreadPool *this,size_t threads)

{
  (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_worker).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::condition_variable::condition_variable(&this->_waiting);
  *(undefined8 *)((long)&(this->_creation).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_creation).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_creation).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_runningThreadCount).super___atomic_base<unsigned_long>._M_i = 0;
  (this->_creation).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_creation).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_creation).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_creation).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->_completeCreation);
  this->_threadCount = 0;
  this->_threadsCreated = false;
  (this->_task).super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_task;
  (this->_task).super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_task;
  (this->_task).super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
  _M_impl._M_node._M_size = 0;
  (this->_taskInfo).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_taskInfo).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_taskInfo).super___mutex_base._M_mutex + 0x10) = 0;
  *(undefined8 *)((long)&(this->_taskInfo).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_taskInfo).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_taskInfo).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_taskInfo).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  resize(this,threads);
  return;
}

Assistant:

ThreadPool::ThreadPool( size_t threads )
    : _runningThreadCount ( 0 )
    , _threadCount        ( 0 )
    , _threadsCreated     ( false )
{
    resize( threads );
}